

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void libtorrent::aux::anon_unknown_135::pick_busy_blocks
               (piece_picker *picker,piece_index_t piece,int blocks_in_piece,int timed_out,
               vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               *interesting_blocks,downloading_piece *pi)

{
  undefined1 auVar1 [16];
  long lVar2;
  busy_block_t this;
  busy_block_t *pbVar3;
  span<const_libtorrent::aux::piece_picker::block_info> *this_00;
  piece_index_t p_index;
  int b_index;
  long lVar4;
  unsigned_long uVar5;
  ulong uVar6;
  busy_block_t *pbVar7;
  block_info *pbVar8;
  busy_block_t *pbVar9;
  int *__args_1;
  span<const_libtorrent::aux::piece_picker::block_info> sVar10;
  span<libtorrent::aux::(anonymous_namespace)::busy_block_t> sVar11;
  busy_block_t abStack_170 [2];
  busy_block_t *local_160;
  busy_block_t *local_158;
  span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *local_150;
  int local_144;
  busy_block_t *local_140;
  uint local_134;
  busy_block_t *local_130;
  difference_type local_128;
  block_info *local_120;
  busy_block_t *local_118;
  busy_block_t *local_110;
  busy_block_t *block;
  busy_block_t *__end2_1;
  busy_block_t *__begin2_1;
  span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *__range2_1;
  busy_block_t *pbStack_e8;
  int local_dc;
  piece_block local_d8;
  piece_block b;
  block_info *info;
  block_info *__end2;
  block_info *__begin2;
  span<const_libtorrent::aux::piece_picker::block_info> local_a8;
  span<const_libtorrent::aux::piece_picker::block_info> *local_98;
  span<const_libtorrent::aux::piece_picker::block_info> *__range2;
  int idx;
  int busy_count;
  alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t> busy_blocks_destructor;
  busy_block_t *local_70;
  busy_block_t *TORRENT_ALLOCA_tmp;
  busy_block_t *local_58;
  long local_50;
  long TORRENT_ALLOCA_size;
  span<libtorrent::aux::(anonymous_namespace)::busy_block_t> busy_blocks;
  downloading_piece *pi_local;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
  *interesting_blocks_local;
  int timed_out_local;
  int blocks_in_piece_local;
  piece_picker *picker_local;
  piece_index_t piece_local;
  
  pbVar7 = abStack_170 + 1;
  abStack_170[0].peers = 0x69dc49;
  abStack_170[0].index = 0;
  picker_local._4_4_ = piece.m_val;
  span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::span
            ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)&TORRENT_ALLOCA_size);
  abStack_170[0].peers = 0x69dc51;
  abStack_170[0].index = 0;
  lVar4 = numeric_cast<long,int,void>(blocks_in_piece);
  local_50 = lVar4;
  if (lVar4 < 0x201) {
    if (0 < blocks_in_piece) {
      lVar2 = -((long)blocks_in_piece * 8 + 0xfU & 0xfffffffffffffff0);
      pbVar7 = (busy_block_t *)((long)abStack_170 + lVar2 + 8U);
      *(undefined8 *)((long)abStack_170 + lVar2) = 0x69dcde;
      span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::span
                ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                 &busy_blocks_destructor.objects.m_len,pbVar7,lVar4);
      TORRENT_ALLOCA_size = busy_blocks_destructor.objects.m_len;
      busy_blocks.m_ptr = local_70;
      *(undefined8 *)((long)abStack_170 + lVar2) = 0x69dcf7;
      local_118 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::begin
                            ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                             &TORRENT_ALLOCA_size);
      *(undefined8 *)((long)abStack_170 + lVar2) = 0x69dd07;
      pbVar9 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::end
                         ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                          &TORRENT_ALLOCA_size);
      pbVar3 = local_118;
      *(undefined8 *)((long)abStack_170 + lVar2) = 0x69dd16;
      uninitialized_default_construct<libtorrent::aux::(anonymous_namespace)::busy_block_t*>
                (pbVar3,pbVar9);
    }
  }
  else {
    abStack_170[0].peers = 0x69dc67;
    abStack_170[0].index = 0;
    uVar5 = numeric_cast<unsigned_long,int,void>(blocks_in_piece);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    uVar6 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    abStack_170[0].peers = 0x69dc88;
    abStack_170[0].index = 0;
    pbVar7 = (busy_block_t *)operator_new__(uVar6);
    abStack_170[0].peers = 0x69dc98;
    abStack_170[0].index = 0;
    span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::span
              ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)&TORRENT_ALLOCA_tmp,
               pbVar7,local_50);
    TORRENT_ALLOCA_size = (long)TORRENT_ALLOCA_tmp;
    busy_blocks.m_ptr = local_58;
    pbVar7 = abStack_170 + 1;
  }
  pbVar7[-1].peers = 0x69dd25;
  pbVar7[-1].index = 0;
  span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::
  span<libtorrent::span<libtorrent::aux::(anonymous_namespace)::busy_block_t>,libtorrent::aux::(anonymous_namespace)::busy_block_t,void>
            ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)&idx,
             (span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)&TORRENT_ALLOCA_size);
  __range2._4_4_ = 0;
  __range2._0_4_ = -1;
  pbVar7[-1].peers = 0x69dd46;
  pbVar7[-1].index = 0;
  sVar10 = piece_picker::blocks_for_piece(picker,pi);
  local_128 = sVar10.m_len;
  local_120 = sVar10.m_ptr;
  local_a8.m_ptr = local_120;
  local_a8.m_len = local_128;
  local_98 = &local_a8;
  pbVar7[-1].peers = 0x69dd8c;
  pbVar7[-1].index = 0;
  __end2 = span<const_libtorrent::aux::piece_picker::block_info>::begin(&local_a8);
  this_00 = local_98;
  pbVar7[-1].peers = 0x69dd9f;
  pbVar7[-1].index = 0;
  pbVar8 = span<const_libtorrent::aux::piece_picker::block_info>::end(this_00);
  for (; p_index.m_val = picker_local._4_4_, __end2 != pbVar8; __end2 = __end2 + 1) {
    b = (piece_block)__end2;
    b_index = (int)__range2 + 1;
    __range2._0_4_ = b_index;
    if (*(ushort *)&__end2->field_0x8 >> 0xe == 1) {
      local_dc = picker_local._4_4_;
      pbVar7[-1].peers = 0x69de34;
      pbVar7[-1].index = 0;
      piece_block::piece_block(&local_d8,p_index,b_index);
      if ((int)(uint)(*(ushort *)((long)b + 8) & 0x3fff) <= timed_out) {
        local_134 = *(ushort *)((long)b + 8) & 0x3fff;
        lVar4 = (long)__range2._4_4_;
        pbVar7[-1].peers = 0x69de78;
        pbVar7[-1].index = 0;
        local_130 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::operator[]
                              ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                               &TORRENT_ALLOCA_size,lVar4);
        local_130->peers = local_134;
        local_144 = (int)__range2;
        lVar4 = (long)__range2._4_4_;
        pbVar7[-1].peers = 0x69deac;
        pbVar7[-1].index = 0;
        local_140 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::operator[]
                              ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                               &TORRENT_ALLOCA_size,lVar4);
        local_140->index = local_144;
        __range2._4_4_ = __range2._4_4_ + 1;
      }
    }
  }
  lVar4 = (long)__range2._4_4_;
  pbVar7[-1].peers = 0x69defb;
  pbVar7[-1].index = 0;
  sVar11 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::first
                     ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                      &TORRENT_ALLOCA_size,lVar4);
  local_158 = (busy_block_t *)sVar11.m_len;
  local_150 = (span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)sVar11.m_ptr;
  abStack_170[1] = (busy_block_t)&TORRENT_ALLOCA_size;
  __range2_1 = local_150;
  pbStack_e8 = local_158;
  TORRENT_ALLOCA_size = (long)local_150;
  busy_blocks.m_ptr = local_158;
  pbVar7[-1].peers = 0x69df42;
  pbVar7[-1].index = 0;
  local_160 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::begin
                        ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                         &TORRENT_ALLOCA_size);
  this = abStack_170[1];
  pbVar7[-1].peers = 0x69df55;
  pbVar7[-1].index = 0;
  pbVar9 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::end
                     ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)this);
  pbVar3 = local_160;
  pbVar7[-1].peers = 0x69df64;
  pbVar7[-1].index = 0;
  ::std::sort<libtorrent::aux::(anonymous_namespace)::busy_block_t*>(pbVar3,pbVar9);
  __begin2_1 = (busy_block_t *)&TORRENT_ALLOCA_size;
  pbVar7[-1].peers = 0x69df7d;
  pbVar7[-1].index = 0;
  __end2_1 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::begin
                       ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)
                        &TORRENT_ALLOCA_size);
  pbVar3 = __begin2_1;
  pbVar7[-1].peers = 0x69df90;
  pbVar7[-1].index = 0;
  block = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::end
                    ((span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)pbVar3);
  for (; __end2_1 != block; __end2_1 = __end2_1 + 1) {
    local_110 = __end2_1;
    __args_1 = &__end2_1->index;
    pbVar7[-1].peers = 0x69dfcd;
    pbVar7[-1].index = 0;
    ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
    emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int_const&>
              ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
               interesting_blocks,
               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ((long)&picker_local + 4),__args_1);
  }
  pbVar7[-1].peers = 0x69dfee;
  pbVar7[-1].index = 0;
  alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t>::~alloca_destructor
            ((alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)&idx);
  return;
}

Assistant:

void pick_busy_blocks(piece_picker const* picker
		, piece_index_t const piece
		, int const blocks_in_piece
		, int const timed_out
		, std::vector<piece_block>& interesting_blocks
		, piece_picker::downloading_piece const& pi)
	{
		// if there aren't any free blocks in the piece, and the piece is
		// old enough, we may switch into busy mode for this piece. In this
		// case busy_blocks and busy_count are set to contain the eligible
		// busy blocks we may pick
		// first, figure out which blocks are eligible for picking
		// in "busy-mode"
		TORRENT_ALLOCA(busy_blocks, busy_block_t, blocks_in_piece);
		int busy_count = 0;

		// pick busy blocks from the piece
		int idx = -1;
		for (auto const& info : picker->blocks_for_piece(pi))
		{
			++idx;
			// only consider blocks that have been requested
			// and we're still waiting for them
			if (info.state != piece_picker::block_info::state_requested)
				continue;

			piece_block b(piece, idx);

			// only allow a single additional request per block, in order
			// to spread it out evenly across all stalled blocks
			if (int(info.num_peers) > timed_out)
				continue;

			busy_blocks[busy_count].peers = info.num_peers;
			busy_blocks[busy_count].index = idx;
			++busy_count;

#if TORRENT_DEBUG_STREAMING > 1
			std::printf(" [%d (%d)]", b.block_index, info.num_peers);
#endif
		}
#if TORRENT_DEBUG_STREAMING > 1
		std::printf("\n");
#endif

		busy_blocks = busy_blocks.first(busy_count);

		// then sort blocks by the number of peers with requests
		// to the blocks (request the blocks with the fewest peers
		// first)
		std::sort(busy_blocks.begin(), busy_blocks.end());

		// then insert them into the interesting_blocks vector
		for (auto const& block : busy_blocks)
			interesting_blocks.emplace_back(piece, block.index);
	}